

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitIsop.c
# Opt level: O0

void Kit_TruthIsopPrintCover(Vec_Int_t *vCover,int nVars,int fCompl)

{
  int iVar1;
  uint uVar2;
  int Literal;
  int Entry;
  int k;
  int i;
  int fCompl_local;
  int nVars_local;
  Vec_Int_t *vCover_local;
  
  iVar1 = Vec_IntSize(vCover);
  if ((iVar1 == 0) ||
     ((iVar1 = Vec_IntSize(vCover), iVar1 == 1 && (iVar1 = Vec_IntEntry(vCover,0), iVar1 == 0)))) {
    uVar2 = Vec_IntSize(vCover);
    printf("Constant %d\n",(ulong)uVar2);
  }
  else {
    for (Entry = 0; iVar1 = Vec_IntSize(vCover), Entry < iVar1; Entry = Entry + 1) {
      iVar1 = Vec_IntEntry(vCover,Entry);
      for (Literal = 0; Literal < nVars; Literal = Literal + 1) {
        uVar2 = iVar1 >> ((byte)(Literal << 1) & 0x1f) & 3;
        if (uVar2 == 1) {
          printf("0");
        }
        else if (uVar2 == 2) {
          printf("1");
        }
        else {
          if (uVar2 != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                          ,0xca,"void Kit_TruthIsopPrintCover(Vec_Int_t *, int, int)");
          }
          printf("-");
        }
      }
      printf(" %d\n",(ulong)((fCompl != 0 ^ 0xffU) & 1));
    }
  }
  return;
}

Assistant:

void Kit_TruthIsopPrintCover( Vec_Int_t * vCover, int nVars, int fCompl )
{
    int i, k, Entry, Literal;
    if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover, 0) == 0) )
    {
        printf( "Constant %d\n", Vec_IntSize(vCover) );
        return;
    }
    Vec_IntForEachEntry( vCover, Entry, i )
    { 
        for ( k = 0; k < nVars; k++ )
        {
            Literal = 3 & (Entry >> (k << 1));
            if ( Literal == 1 ) // neg literal
                printf( "0" );
            else if ( Literal == 2 ) // pos literal
                printf( "1" );
            else if ( Literal == 0 ) 
                printf( "-" );
            else assert( 0 );
        }
        printf( " %d\n", !fCompl );
    }
}